

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadFloatArray
          (CrateReader *this,bool is_compressed,vector<float,_std::allocator<float>_> *d)

{
  StreamReader *pSVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  void *pvVar5;
  float *pfVar6;
  ssize_t sVar7;
  int *out;
  size_type sVar8;
  iterator __first;
  iterator __last;
  uint *out_00;
  reference puVar9;
  reference pvVar10;
  iterator iStack_5a8;
  uint index;
  iterator __end5;
  iterator __begin5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range5;
  float *o;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  vector<float,_std::allocator<float>_> lut;
  uint32_t lutSize;
  undefined1 local_538 [8];
  vector<int,_std::allocator<int>_> ints;
  char code;
  size_t sz;
  ostringstream local_4f0 [8];
  ostringstream ss_e_2;
  string local_378;
  ostringstream local_358 [8];
  ostringstream ss_e_1;
  ulong local_1e0;
  uint64_t n_1;
  undefined1 local_1d0 [4];
  uint32_t n;
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  uint32_t local_34;
  ulong uStack_30;
  uint32_t shapesize;
  size_t length;
  vector<float,_std::allocator<float>_> *d_local;
  CrateReader *pCStack_18;
  bool is_compressed_local;
  CrateReader *this_local;
  
  length = (size_t)d;
  d_local._7_1_ = is_compressed;
  pCStack_18 = this;
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar2 = StreamReader::read4(this->_sr,&local_34);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_1b0);
      poVar3 = ::std::operator<<((ostream *)local_1b0,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadFloatArray");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x21d);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_1b0,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)local_1d0);
      ::std::__cxx11::string::~string((string *)local_1d0);
      ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
      this_local._7_1_ = 0;
      goto LAB_00213743;
    }
    bVar2 = StreamReader::read4(this->_sr,(uint32_t *)((long)&n_1 + 4));
    if (!bVar2) {
      ::std::__cxx11::string::operator+=
                ((string *)&this->_err,"Failed to read the number of array elements.\n");
      this_local._7_1_ = 0;
      goto LAB_00213743;
    }
    uStack_30 = (ulong)n_1._4_4_;
  }
  else {
    bVar2 = StreamReader::read8(this->_sr,&local_1e0);
    if (!bVar2) {
      ::std::__cxx11::string::operator+=
                ((string *)&this->_err,"Failed to read the number of array elements.\n");
      this_local._7_1_ = 0;
      goto LAB_00213743;
    }
    uStack_30 = local_1e0;
  }
  if ((this->_config).maxArrayElements < uStack_30) {
    ::std::__cxx11::ostringstream::ostringstream(local_358);
    poVar3 = ::std::operator<<((ostream *)local_358,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,"[Crate]");
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ReadFloatArray");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x231);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_358,"Too many array elements.");
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_378);
    ::std::__cxx11::string::~string((string *)&local_378);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_358);
  }
  else {
    this->_memoryUsage = uStack_30 * 4 + this->_memoryUsage;
    if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
      ::std::__cxx11::ostringstream::ostringstream(local_4f0);
      poVar3 = ::std::operator<<((ostream *)local_4f0,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadFloatArray");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x234);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_4f0,"Reached to max memory budget.");
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&sz);
      ::std::__cxx11::string::~string((string *)&sz);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_4f0);
    }
    else {
      ::std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)length,uStack_30);
      if ((d_local._7_1_ & 1) == 0) {
        pSVar1 = this->_sr;
        lVar4 = uStack_30 << 2;
        pvVar5 = (void *)(uStack_30 << 2);
        pfVar6 = ::std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)length);
        sVar7 = StreamReader::read(pSVar1,(int)lVar4,pvVar5,(size_t)pfVar6);
        if (sVar7 == 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)&this->_err,"Failed to read float array data.\n");
          this_local._7_1_ = 0;
        }
        else {
          this_local._7_1_ = 1;
        }
      }
      else if (uStack_30 < 0x10) {
        pvVar5 = (void *)(uStack_30 << 2);
        pSVar1 = this->_sr;
        pfVar6 = ::std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)length);
        sVar7 = StreamReader::read(pSVar1,(int)pvVar5,pvVar5,(size_t)pfVar6);
        if (sVar7 == 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)&this->_err,"Failed to read uncompressed array data.\n");
          this_local._7_1_ = 0;
        }
        else {
          this_local._7_1_ = 1;
        }
      }
      else {
        bVar2 = StreamReader::read1(this->_sr,
                                    (char *)((long)&ints.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 7));
        if (bVar2) {
          if (ints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._7_1_ == 'i') {
            ::std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_538);
            ::std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)local_538,uStack_30);
            out = ::std::vector<int,_std::allocator<int>_>::data
                            ((vector<int,_std::allocator<int>_> *)local_538);
            sVar8 = ::std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)local_538);
            bVar2 = ReadCompressedInts<int>(this,out,sVar8);
            if (bVar2) {
              __first = ::std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)local_538);
              __last = ::std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)local_538);
              pfVar6 = ::std::vector<float,_std::allocator<float>_>::data
                                 ((vector<float,_std::allocator<float>_> *)length);
              ::std::
              copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,float*>
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         __first._M_current,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         __last._M_current,pfVar6);
            }
            else {
              ::std::__cxx11::string::operator+=
                        ((string *)&this->_err,"Failed to read compressed ints in ReadFloatArray.\n"
                        );
              this_local._7_1_ = 0;
            }
            ::std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)local_538);
            if (!bVar2) goto LAB_00213743;
          }
          else {
            if (ints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._7_1_ != 't') {
              ::std::__cxx11::string::operator+=
                        ((string *)&this->_err,"Invalid code. Data is currupted\n");
              this_local._7_1_ = 0;
              goto LAB_00213743;
            }
            bVar2 = StreamReader::read4(this->_sr,
                                        (uint32_t *)
                                        ((long)&lut.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4));
            if (!bVar2) {
              ::std::__cxx11::string::operator+=
                        ((string *)&this->_err,"Failed to read lutSize in ReadFloatArray.\n");
              this_local._7_1_ = 0;
              goto LAB_00213743;
            }
            ::std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)
                       &indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)
                       &indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (ulong)lut.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_);
            pSVar1 = this->_sr;
            pfVar6 = ::std::vector<float,_std::allocator<float>_>::data
                               ((vector<float,_std::allocator<float>_> *)
                                &indexes.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            sVar7 = StreamReader::read(pSVar1,lut.super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _4_4_ << 2,
                                       (void *)((ulong)lut.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _4_4_ << 2),(size_t)pfVar6);
            if (sVar7 == 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)&this->_err,"Failed to read lut table in ReadFloatArray.\n");
              this_local._7_1_ = 0;
              bVar2 = true;
            }
            else {
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o);
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o,uStack_30);
              out_00 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o);
              sVar8 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o);
              bVar2 = ReadCompressedInts<unsigned_int>(this,out_00,sVar8);
              if (bVar2) {
                __range5 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           ::std::vector<float,_std::allocator<float>_>::data
                                     ((vector<float,_std::allocator<float>_> *)length);
                __end5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o);
                iStack_5a8 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o);
                while (bVar2 = __gnu_cxx::operator!=(&__end5,&stack0xfffffffffffffa58), bVar2) {
                  puVar9 = __gnu_cxx::
                           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           ::operator*(&__end5);
                  pvVar10 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                      ((vector<float,_std::allocator<float>_> *)
                                       &indexes.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (ulong)*puVar9);
                  *(value_type *)
                   &(__range5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start = *pvVar10;
                  __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator++(&__end5);
                  __range5 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             ((long)&(__range5->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 4);
                }
                bVar2 = false;
              }
              else {
                ::std::__cxx11::string::operator+=
                          ((string *)&this->_err,"Failed to read lut indices in ReadFloatArray.\n");
                this_local._7_1_ = 0;
                bVar2 = true;
              }
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&o);
            }
            ::std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)
                       &indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar2) goto LAB_00213743;
          }
          this_local._7_1_ = 1;
        }
        else {
          ::std::__cxx11::string::operator+=((string *)&this->_err,"Failed to read the code.\n");
          this_local._7_1_ = 0;
        }
      }
    }
  }
LAB_00213743:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadFloatArray(bool is_compressed, std::vector<float> *d) {

  size_t length;
  // < ver 0.7.0  use 32bit
  if (VERSION_LESS_THAN_0_8_0(_version)) {
      uint32_t shapesize; // not used
      if (!_sr->read4(&shapesize)) {
        PUSH_ERROR("Failed to read the number of array elements.");
        return false;
      }
    uint32_t n;
    if (!_sr->read4(&n)) {
      _err += "Failed to read the number of array elements.\n";
      return false;
    }
    length = size_t(n);
  } else {
    uint64_t n;
    if (!_sr->read8(&n)) {
      _err += "Failed to read the number of array elements.\n";
      return false;
    }

    length = size_t(n);
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(length * sizeof(float));

  d->resize(length);

  if (!is_compressed) {

    // TODO(syoyo): Zero-copy
    if (!_sr->read(sizeof(float) * length, sizeof(float) * length,
                   reinterpret_cast<uint8_t *>(d->data()))) {
      _err += "Failed to read float array data.\n";
      return false;
    }

    return true;
  } else {

    //
    // compressed data is represented by integers or look-up table.
    //

    if (length < crate::kMinCompressedArraySize) {
      size_t sz = sizeof(float) * length;
      // Not stored in compressed.
      // reader.ReadContiguous(odata, osize);
      if (!_sr->read(sz, sz, reinterpret_cast<uint8_t *>(d->data()))) {
        _err += "Failed to read uncompressed array data.\n";
        return false;
      }
      return true;
    }

    // Read the code
    char code;
    if (!_sr->read1(&code)) {
      _err += "Failed to read the code.\n";
      return false;
    }

    if (code == 'i') {
      // Compressed integers.
      std::vector<int32_t> ints;
      ints.resize(length);
      if (!ReadCompressedInts(ints.data(), ints.size())) {
        _err += "Failed to read compressed ints in ReadFloatArray.\n";
        return false;
      }
      std::copy(ints.begin(), ints.end(), d->data());
    } else if (code == 't') {
      // Lookup table & indexes.
      uint32_t lutSize;
      if (!_sr->read4(&lutSize)) {
        _err += "Failed to read lutSize in ReadFloatArray.\n";
        return false;
      }

      std::vector<float> lut;
      lut.resize(lutSize);
      if (!_sr->read(sizeof(float) * lutSize, sizeof(float) * lutSize,
                     reinterpret_cast<uint8_t *>(lut.data()))) {
        _err += "Failed to read lut table in ReadFloatArray.\n";
        return false;
      }

      std::vector<uint32_t> indexes;
      indexes.resize(length);
      if (!ReadCompressedInts(indexes.data(), indexes.size())) {
        _err += "Failed to read lut indices in ReadFloatArray.\n";
        return false;
      }

      auto o = d->data();
      for (auto index : indexes) {
        *o++ = lut[index];
      }
    } else {
      _err += "Invalid code. Data is currupted\n";
      return false;
    }

    return true;
  }

}